

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prog.cc
# Opt level: O3

void __thiscall
duckdb_re2::Prog::EmitList
          (Prog *this,int root,SparseArray<int> *rootmap,
          vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_> *flat,
          SparseSet *reachable,vector<int,_std::allocator<int>_> *stk)

{
  uint uVar1;
  Inst *pIVar2;
  IndexValue *pIVar3;
  iterator iVar4;
  _Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
  _Var5;
  pointer pIVar7;
  int *piVar8;
  int iVar9;
  iterator iVar10;
  int *piVar11;
  Deleter local_38;
  anon_union_4_5_a14c903b_for_Inst_2 local_34;
  uint uVar6;
  
  reachable->size_ = 0;
  piVar8 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_start;
  iVar10._M_current =
       (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
       _M_finish;
  if (iVar10._M_current != piVar8) {
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar8;
    iVar10._M_current = piVar8;
  }
  local_38.len_ = root;
  if (iVar10._M_current ==
      (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
      _M_end_of_storage) {
    std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
              ((vector<int,std::allocator<int>> *)stk,iVar10,&local_38.len_);
    piVar8 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
             _M_start;
    piVar11 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish;
  }
  else {
    *iVar10._M_current = root;
    piVar11 = iVar10._M_current + 1;
    (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
         piVar11;
  }
  if (piVar8 == piVar11) {
    return;
  }
LAB_0183ceac:
  _Var5._M_head_impl.len_ = (Deleter)piVar11[-1];
  (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_finish =
       piVar11 + -1;
  do {
    piVar8 = (reachable->dense_).ptr_._M_t.
             super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
             super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
             super__Head_base<0UL,_int_*,_false>._M_head_impl;
    if ((piVar8 != (int *)0x0) &&
       ((uint)_Var5._M_head_impl.len_ <
        (uint)*(int *)&(reachable->dense_).ptr_._M_t.
                       super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                       super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Tuple_impl<1UL,_duckdb_re2::PODArray<int>::Deleter>.
                       super__Head_base<1UL,_duckdb_re2::PODArray<int>::Deleter,_false>)) {
      piVar11 = (reachable->sparse_).ptr_._M_t.
                super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                super__Head_base<0UL,_int_*,_false>._M_head_impl;
      uVar6 = piVar11[(int)_Var5._M_head_impl.len_];
      uVar1 = reachable->size_;
      if ((uVar6 < uVar1) && ((Deleter)piVar8[(int)uVar6] == _Var5._M_head_impl.len_))
      goto LAB_0183d083;
      piVar11[(int)_Var5._M_head_impl.len_] = uVar1;
      ((Deleter *)(piVar8 + (int)uVar1))->len_ = (int)_Var5._M_head_impl.len_;
      reachable->size_ = reachable->size_ + 1;
    }
    if ((((_Var5._M_head_impl.len_ != (Deleter)local_38.len_) &&
         (pIVar3 = (rootmap->dense_).ptr_._M_t.
                   super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                   ._M_t.
                   super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                   .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>.
                   _M_head_impl, pIVar3 != (IndexValue *)0x0)) &&
        ((uint)_Var5._M_head_impl.len_ <
         (uint)*(int *)&(rootmap->dense_).ptr_._M_t.
                        super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        ._M_t.
                        super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Tuple_impl<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
                        .
                        super__Head_base<1UL,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter,_false>
        )) && ((uVar6 = (rootmap->sparse_).ptr_._M_t.
                        super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
                        super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
                        super__Head_base<0UL,_int_*,_false>._M_head_impl
                        [(int)_Var5._M_head_impl.len_], uVar6 < (uint)rootmap->size_ &&
               ((Deleter)pIVar3[(int)uVar6].index_ == _Var5._M_head_impl.len_)))) {
      iVar4._M_current =
           (flat->
           super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
        _M_realloc_insert<>(flat,iVar4);
        pIVar7 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar4._M_current)->out_opcode_ = 0;
        (iVar4._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
        pIVar7 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
        _M_impl.super__Vector_impl_data._M_finish = pIVar7;
      }
      uVar6 = pIVar7[-1].out_opcode_;
      pIVar7[-1].out_opcode_ = uVar6 & 0xfffffff8 | 6;
      pIVar7[-1].out_opcode_ =
           uVar6 & 8 | 6 |
           (rootmap->dense_).ptr_._M_t.
           super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           ._M_t.
           super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
           .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
           [(rootmap->sparse_).ptr_._M_t.
            super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>._M_t.
            super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
            super__Head_base<0UL,_int_*,_false>._M_head_impl[(int)_Var5._M_head_impl.len_]].value_
           << 4;
      goto LAB_0183d083;
    }
    pIVar2 = (this->inst_).ptr_._M_t.
             super___uniq_ptr_impl<duckdb_re2::Prog::Inst,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             ._M_t.
             super__Tuple_impl<0UL,_duckdb_re2::Prog::Inst_*,_duckdb_re2::PODArray<duckdb_re2::Prog::Inst>::Deleter>
             .super__Head_base<0UL,_duckdb_re2::Prog::Inst_*,_false>._M_head_impl;
    uVar6 = pIVar2[(int)_Var5._M_head_impl.len_].out_opcode_;
    switch(uVar6 & 7) {
    case 1:
      iVar4._M_current =
           (flat->
           super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
        _M_realloc_insert<>(flat,iVar4);
        pIVar7 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar4._M_current)->out_opcode_ = 0;
        (iVar4._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
        pIVar7 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
        _M_impl.super__Vector_impl_data._M_finish = pIVar7;
      }
      iVar9 = (int)((ulong)((long)pIVar7 -
                           (long)(flat->
                                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                                 )._M_impl.super__Vector_impl_data._M_start) >> 3);
      pIVar7[-1].out_opcode_ = (pIVar7[-1].out_opcode_ & 8) + iVar9 * 0x10 + 1;
      pIVar7[-1].field_1.out1_ = iVar9 + 1;
    case 0:
      local_34 = pIVar2[(int)_Var5._M_head_impl.len_].field_1;
      iVar10._M_current =
           (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
           _M_finish;
      if (iVar10._M_current ==
          (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
          _M_end_of_storage) {
        std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>(stk,iVar10,&local_34.cap_);
      }
      else {
        *iVar10._M_current = (int)local_34;
        (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish = iVar10._M_current + 1;
      }
      uVar6 = pIVar2[(int)_Var5._M_head_impl.len_].out_opcode_;
    case 6:
      _Var5._M_head_impl.len_ = (Deleter)(uVar6 >> 4);
      break;
    default:
      goto switchD_0183cf0c_caseD_2;
    case 5:
    case 7:
      iVar4._M_current =
           (flat->
           super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
           _M_impl.super__Vector_impl_data._M_finish;
      if (iVar4._M_current ==
          (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
        _M_realloc_insert<>(flat,iVar4);
        pIVar7 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      }
      else {
        (iVar4._M_current)->out_opcode_ = 0;
        (iVar4._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
        pIVar7 = (flat->
                 super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>
                 )._M_impl.super__Vector_impl_data._M_finish + 1;
        (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
        _M_impl.super__Vector_impl_data._M_finish = pIVar7;
      }
      pIVar7[-1] = pIVar2[(int)_Var5._M_head_impl.len_];
      goto LAB_0183d083;
    }
  } while( true );
switchD_0183cf0c_caseD_2:
  iVar4._M_current =
       (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar4._M_current ==
      (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>::
    _M_realloc_insert<>(flat,iVar4);
    pIVar7 = (flat->
             super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
             _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (iVar4._M_current)->out_opcode_ = 0;
    (iVar4._M_current)->field_1 = (anon_union_4_5_a14c903b_for_Inst_2)0x0;
    pIVar7 = (flat->
             super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
             _M_impl.super__Vector_impl_data._M_finish + 1;
    (flat->super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
    _M_impl.super__Vector_impl_data._M_finish = pIVar7;
  }
  pIVar7[-1] = pIVar2[(int)_Var5._M_head_impl.len_];
  pIVar7 = (flat->
           super__Vector_base<duckdb_re2::Prog::Inst,_std::allocator<duckdb_re2::Prog::Inst>_>).
           _M_impl.super__Vector_impl_data._M_finish;
  pIVar7[-1].out_opcode_ =
       pIVar7[-1].out_opcode_ & 0xf |
       (rootmap->dense_).ptr_._M_t.
       super___uniq_ptr_impl<duckdb_re2::SparseArray<int>::IndexValue,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_duckdb_re2::PODArray<duckdb_re2::SparseArray<int>::IndexValue>::Deleter>
       .super__Head_base<0UL,_duckdb_re2::SparseArray<int>::IndexValue_*,_false>._M_head_impl
       [(rootmap->sparse_).ptr_._M_t.super___uniq_ptr_impl<int,_duckdb_re2::PODArray<int>::Deleter>.
        _M_t.super__Tuple_impl<0UL,_int_*,_duckdb_re2::PODArray<int>::Deleter>.
        super__Head_base<0UL,_int_*,_false>._M_head_impl
        [pIVar2[(int)_Var5._M_head_impl.len_].out_opcode_ >> 4]].value_ << 4;
LAB_0183d083:
  piVar11 = (stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
            _M_finish;
  if ((stk->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data._M_start
      == piVar11) {
    return;
  }
  goto LAB_0183ceac;
}

Assistant:

void Prog::EmitList(int root, SparseArray<int>* rootmap,
                    std::vector<Inst>* flat,
                    SparseSet* reachable, std::vector<int>* stk) {
  reachable->clear();
  stk->clear();
  stk->push_back(root);
  while (!stk->empty()) {
    int id = stk->back();
    stk->pop_back();
  Loop:
    if (reachable->contains(id))
      continue;
    reachable->insert_new(id);

    if (id != root && rootmap->has_index(id)) {
      // We reached another "tree" via epsilon transition. Emit a kInstNop
      // instruction so that the Prog does not become quadratically larger.
      flat->emplace_back();
      flat->back().set_opcode(kInstNop);
      flat->back().set_out(rootmap->get_existing(id));
      continue;
    }

    Inst* ip = inst(id);
    switch (ip->opcode()) {
      default:
        LOG(DFATAL) << "unhandled opcode: " << ip->opcode();
        break;

      case kInstAltMatch:
        flat->emplace_back();
        flat->back().set_opcode(kInstAltMatch);
        flat->back().set_out(static_cast<int>(flat->size()));
        flat->back().out1_ = static_cast<uint32_t>(flat->size())+1;
        FALLTHROUGH_INTENDED;

      case kInstAlt:
        stk->push_back(ip->out1());
        id = ip->out();
        goto Loop;

      case kInstByteRange:
      case kInstCapture:
      case kInstEmptyWidth:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        flat->back().set_out(rootmap->get_existing(ip->out()));
        break;

      case kInstNop:
        id = ip->out();
        goto Loop;

      case kInstMatch:
      case kInstFail:
        flat->emplace_back();
        memmove(&flat->back(), ip, sizeof *ip);
        break;
    }
  }
}